

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O2

void Rwr_ManWriteToFile(Rwr_Man_t *p,char *pFileName)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  ulong uVar3;
  abctime aVar4;
  long lVar5;
  void *__ptr;
  ulong uVar6;
  FILE *__s;
  abctime aVar7;
  int level;
  int iVar8;
  ulong uVar9;
  int nEntries;
  
  aVar4 = Abc_Clock();
  pVVar1 = p->vForest;
  lVar5 = (long)pVVar1->nSize;
  uVar9 = lVar5 - 5;
  iVar8 = (int)uVar9;
  nEntries = iVar8;
  __ptr = malloc(lVar5 * 8 - 0x28);
  uVar6 = 0;
  uVar9 = uVar9 & 0xffffffff;
  if (iVar8 < 1) {
    uVar9 = uVar6;
  }
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    pvVar2 = pVVar1->pArray[uVar6 + 5];
    uVar3 = *(ulong *)((long)pvVar2 + 0x18);
    iVar8 = *(int *)(uVar3 & 0xfffffffffffffffe);
    *(uint *)((long)__ptr + uVar6 * 8 + 4) =
         ((uint)*(ulong *)((long)pvVar2 + 0x20) & 1) +
         *(int *)(*(ulong *)((long)pvVar2 + 0x20) & 0xfffffffffffffffe) * 2;
    *(uint *)((long)__ptr + uVar6 * 8) =
         *(uint *)((long)pvVar2 + 0xe) >> 0x1f | (((uint)uVar3 & 1) + iVar8 * 2) * 2;
  }
  __s = fopen(pFileName,"wb");
  fwrite(&nEntries,4,1,__s);
  iVar8 = nEntries;
  fwrite(__ptr,4,(long)nEntries * 2,__s);
  free(__ptr);
  fclose(__s);
  level = 0x801ef3;
  printf("The number of nodes saved = %d.   ",(ulong)(uint)iVar8);
  Abc_Print(level,"%s =","Saving");
  aVar7 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar7 - aVar4) / 1000000.0);
  return;
}

Assistant:

void Rwr_ManWriteToFile( Rwr_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Rwr_Node_t * pNode;
    unsigned * pBuffer;
    int i, nEntries;
    abctime clk = Abc_Clock();
    // prepare the buffer
    nEntries = p->vForest->nSize - 5;
    pBuffer = ABC_ALLOC( unsigned, nEntries * 2 );
    for ( i = 0; i < nEntries; i++ )
    {
        pNode = (Rwr_Node_t *)p->vForest->pArray[i+5];
        pBuffer[2*i + 0] = (Rwr_Regular(pNode->p0)->Id << 1) | Rwr_IsComplement(pNode->p0);
        pBuffer[2*i + 1] = (Rwr_Regular(pNode->p1)->Id << 1) | Rwr_IsComplement(pNode->p1);
        // save EXOR flag
        pBuffer[2*i + 0] = (pBuffer[2*i + 0] << 1) | pNode->fExor;

    }
    pFile = fopen( pFileName, "wb" );
    fwrite( &nEntries, sizeof(int), 1, pFile );
    fwrite( pBuffer, sizeof(unsigned), nEntries * 2, pFile );
    ABC_FREE( pBuffer );
    fclose( pFile );
    printf( "The number of nodes saved = %d.   ", nEntries );  ABC_PRT( "Saving", Abc_Clock() - clk );
}